

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

CallCommand * __thiscall AssemblyCode::CallCommand::ToString_abi_cxx11_(CallCommand *this)

{
  bool bVar1;
  reference pCVar2;
  long in_RSI;
  CTemp local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  undefined1 local_c0 [8];
  CTemp argument;
  const_iterator __end1;
  const_iterator __begin1;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *__range1;
  CLabel local_78;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [8];
  string command;
  CallCommand *this_local;
  
  IRT::CLabel::ToString_abi_cxx11_(&local_78);
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"call (");
  std::operator+(local_38,(char *)local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&local_78);
  __end1 = std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::begin
                     ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)(in_RSI + 0x28));
  argument._24_8_ =
       std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::end
                 ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)(in_RSI + 0x28));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>
                                *)&argument.field_0x18);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>
             ::operator*(&__end1);
    IRT::CTemp::CTemp((CTemp *)local_c0,pCVar2);
    IRT::CTemp::ToString_abi_cxx11_(&local_100);
    std::operator+(local_e0,(char *)&local_100);
    std::__cxx11::string::operator+=((string *)local_38,(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    IRT::CTemp::~CTemp((CTemp *)local_c0);
    __gnu_cxx::
    __normal_iterator<const_IRT::CTemp_*,_std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>_>::
    operator++(&__end1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

std::string AssemblyCode::CallCommand::ToString( ) const {
    std::string command = "call (" + address.ToString( ) + ") ";
    for ( auto argument : arguments ) {
        command += argument.ToString( ) + " ";
    }
    return command + "\n";
}